

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O3

void __thiscall
vkt::image::anon_unknown_2::BinaryAtomicEndResultInstance::prepareDescriptors
          (BinaryAtomicEndResultInstance *this)

{
  Move<vk::Handle<(vk::HandleType)21>_> *pMVar1;
  Move<vk::Handle<(vk::HandleType)19>_> *pMVar2;
  Move<vk::Handle<(vk::HandleType)22>_> *pMVar3;
  VkDescriptorSetLayout obj;
  VkDescriptorPool obj_00;
  void *pvVar4;
  DeviceInterface *pDVar5;
  Handle<(vk::HandleType)21> HVar6;
  VkDevice pVVar7;
  VkAllocationCallbacks *pVVar8;
  Handle<(vk::HandleType)19> HVar9;
  VkDevice device;
  DeviceInterface *vk;
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  DescriptorSetUpdateBuilder *this_02;
  VkDescriptorImageInfo descResultImageInfo;
  Move<vk::Handle<(vk::HandleType)21>_> local_b8;
  Move<vk::Handle<(vk::HandleType)19>_> local_98;
  DescriptorSetLayoutBuilder local_78;
  
  device = Context::getDevice((this->super_BinaryAtomicInstanceBase).super_TestInstance.m_context);
  vk = Context::getDeviceInterface
                 ((this->super_BinaryAtomicInstanceBase).super_TestInstance.m_context);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_78);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      (&local_78,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1,0x20,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build(&local_98,this_00,vk,device,0);
  pVVar8 = local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator;
  pVVar7 = local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device;
  pDVar5 = local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface;
  HVar9.m_internal =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal = 0;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  pMVar2 = &(this->super_BinaryAtomicInstanceBase).m_descriptorSetLayout;
  obj.m_internal =
       (this->super_BinaryAtomicInstanceBase).m_descriptorSetLayout.
       super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal;
  if (obj.m_internal == 0) {
    (this->super_BinaryAtomicInstanceBase).m_descriptorSetLayout.
    super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device = pVVar7;
    (this->super_BinaryAtomicInstanceBase).m_descriptorSetLayout.
    super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator = pVVar8;
    (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
         HVar9.m_internal;
    (this->super_BinaryAtomicInstanceBase).m_descriptorSetLayout.
    super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface = pDVar5;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              (&(this->super_BinaryAtomicInstanceBase).m_descriptorSetLayout.
                super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter,obj);
    (this->super_BinaryAtomicInstanceBase).m_descriptorSetLayout.
    super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device =
         local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device;
    (this->super_BinaryAtomicInstanceBase).m_descriptorSetLayout.
    super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
         local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator;
    (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
         local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
    (this->super_BinaryAtomicInstanceBase).m_descriptorSetLayout.
    super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface =
         local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface;
    if (local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                (&local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter,
                 (VkDescriptorSetLayout)
                 local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal);
    }
  }
  local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal = 0;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (local_78.m_immutableSamplers.
      super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.m_immutableSamplers.
                    super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.m_immutableSamplers.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.m_immutableSamplers.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.m_immutableSamplerInfos.
      super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.m_immutableSamplerInfos.
                    super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.m_immutableSamplerInfos.
                          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.m_immutableSamplerInfos.
                          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.m_bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.m_bindings.
                    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.m_bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.m_bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&local_98);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&local_98,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1);
  ::vk::DescriptorPoolBuilder::build(&local_b8,this_01,vk,device,1,1);
  pVVar8 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator;
  pVVar7 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device;
  pDVar5 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface;
  HVar6.m_internal =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device;
  local_78.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface
  ;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal = 0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  pMVar1 = &(this->super_BinaryAtomicInstanceBase).m_descriptorPool;
  obj_00.m_internal =
       (this->super_BinaryAtomicInstanceBase).m_descriptorPool.
       super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
  if (obj_00.m_internal == 0) {
    (this->super_BinaryAtomicInstanceBase).m_descriptorPool.
    super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device = pVVar7;
    (this->super_BinaryAtomicInstanceBase).m_descriptorPool.
    super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator = pVVar8;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal =
         HVar6.m_internal;
    (this->super_BinaryAtomicInstanceBase).m_descriptorPool.
    super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface = pDVar5;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              (&(this->super_BinaryAtomicInstanceBase).m_descriptorPool.
                super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter,obj_00);
    (this->super_BinaryAtomicInstanceBase).m_descriptorPool.
    super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
         (VkDevice)
         local_78.m_bindings.
         super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->super_BinaryAtomicInstanceBase).m_descriptorPool.
    super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)
         local_78.m_immutableSamplerInfos.
         super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal =
         (deUint64)
         local_78.m_bindings.
         super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->super_BinaryAtomicInstanceBase).m_descriptorPool.
    super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)
         local_78.m_bindings.
         super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                (&local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter,
                 (VkDescriptorPool)
                 local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal);
    }
  }
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal = 0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if ((void *)local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal !=
      (void *)0x0) {
    operator_delete((void *)local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
                            m_internal,
                    (long)local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
                          m_device -
                    local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal
                   );
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&local_b8,vk,device,
                    (VkDescriptorPool)
                    (this->super_BinaryAtomicInstanceBase).m_descriptorPool.
                    super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal,
                    (VkDescriptorSetLayout)
                    (this->super_BinaryAtomicInstanceBase).m_descriptorSetLayout.
                    super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal);
  pVVar8 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator;
  pVVar7 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device;
  pDVar5 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface;
  HVar6.m_internal =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device;
  local_78.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface
  ;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal = 0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  pMVar3 = &(this->super_BinaryAtomicInstanceBase).m_descriptorSet;
  pvVar4 = (void *)(this->super_BinaryAtomicInstanceBase).m_descriptorSet.
                   super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
  if (pvVar4 == (void *)0x0) {
    (this->super_BinaryAtomicInstanceBase).m_descriptorSet.
    super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device = pVVar7;
    (this->super_BinaryAtomicInstanceBase).m_descriptorSet.
    super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal =
         (deUint64)pVVar8;
    (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal =
         HVar6.m_internal;
    (this->super_BinaryAtomicInstanceBase).m_descriptorSet.
    super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface = pDVar5;
  }
  else {
    pDVar5 = (this->super_BinaryAtomicInstanceBase).m_descriptorSet.
             super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface;
    local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal =
         (deUint64)pvVar4;
    (*pDVar5->_vptr_DeviceInterface[0x3d])
              (pDVar5,(this->super_BinaryAtomicInstanceBase).m_descriptorSet.
                      super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device,
               (this->super_BinaryAtomicInstanceBase).m_descriptorSet.
               super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal);
    *(undefined4 *)
     &(this->super_BinaryAtomicInstanceBase).m_descriptorSet.
      super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
         local_78.m_bindings.
         super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
    *(undefined4 *)
     ((long)&(this->super_BinaryAtomicInstanceBase).m_descriptorSet.
             super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device + 4) =
         local_78.m_bindings.
         super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    *(undefined4 *)
     &(this->super_BinaryAtomicInstanceBase).m_descriptorSet.
      super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal =
         local_78.m_immutableSamplerInfos.
         super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
         ._M_impl.super__Vector_impl_data._M_start._0_4_;
    *(undefined4 *)
     ((long)&(this->super_BinaryAtomicInstanceBase).m_descriptorSet.
             super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal + 4) =
         local_78.m_immutableSamplerInfos.
         super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
         ._M_impl.super__Vector_impl_data._M_start._4_4_;
    *(undefined4 *)
     &(pMVar3->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal =
         local_78.m_bindings.
         super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
         ._M_impl.super__Vector_impl_data._M_start._0_4_;
    *(undefined4 *)
     ((long)&(this->super_BinaryAtomicInstanceBase).m_descriptorSet.
             super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal + 4) =
         local_78.m_bindings.
         super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
         ._M_impl.super__Vector_impl_data._M_start._4_4_;
    *(undefined4 *)
     &(this->super_BinaryAtomicInstanceBase).m_descriptorSet.
      super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
         local_78.m_bindings.
         super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
         ._M_impl.super__Vector_impl_data._M_finish._0_4_;
    *(undefined4 *)
     ((long)&(this->super_BinaryAtomicInstanceBase).m_descriptorSet.
             super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface + 4) =
         local_78.m_bindings.
         super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
         ._M_impl.super__Vector_impl_data._M_finish._4_4_;
    if ((pointer)local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal !=
        (pointer)0x0) {
      local_78.m_bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal
      ;
      (*(local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface)->
        _vptr_DeviceInterface[0x3d])
                (local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
                 m_deviceIface,
                 local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device,
                 local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator)
      ;
    }
  }
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       (this->super_BinaryAtomicInstanceBase).m_resultImageView.
       super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal = 0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       (VkDevice)
       CONCAT44(local_b8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device.
                _4_4_,1);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&local_78);
  this_02 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)&local_78,
                       (int)(this->super_BinaryAtomicInstanceBase).m_descriptorSet.
                            super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal,
                       (void *)0x0,0);
  ::vk::DescriptorSetUpdateBuilder::update(this_02,vk,device);
  if (local_78.m_immutableSamplers.
      super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.m_immutableSamplers.
                    super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.m_immutableSamplers.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.m_immutableSamplers.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((VkAllocationCallbacks *)
      local_78.m_immutableSamplerInfos.
      super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (VkAllocationCallbacks *)0x0) {
    operator_delete(local_78.m_immutableSamplerInfos.
                    super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.m_immutableSamplerInfos.
                          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.m_immutableSamplerInfos.
                          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&local_78);
  return;
}

Assistant:

void BinaryAtomicEndResultInstance::prepareDescriptors (void)
{
	const VkDevice			device			= m_context.getDevice();
	const DeviceInterface&	deviceInterface = m_context.getDeviceInterface();

	m_descriptorSetLayout =
		DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(deviceInterface, device);

	m_descriptorPool =
		DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE)
		.build(deviceInterface, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);

	m_descriptorSet = makeDescriptorSet(deviceInterface, device, *m_descriptorPool, *m_descriptorSetLayout);

	const VkDescriptorImageInfo	descResultImageInfo = makeDescriptorImageInfo(DE_NULL, *m_resultImageView, VK_IMAGE_LAYOUT_GENERAL);

	DescriptorSetUpdateBuilder()
		.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &descResultImageInfo)
		.update(deviceInterface, device);
}